

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O3

stsentry * Curl_hsts(hsts *h,char *hostname,_Bool subdomain)

{
  char *__s;
  int iVar1;
  time_t tVar2;
  size_t sVar3;
  long lVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  stsentry *e;
  Curl_llist_element *pCVar6;
  char buffer [257];
  undefined4 local_13c;
  char local_138 [264];
  
  local_13c = (undefined4)CONCAT71(in_register_00000011,subdomain);
  if (h == (hsts *)0x0) {
LAB_006dea94:
    e = (stsentry *)0x0;
  }
  else {
    e = (stsentry *)0x0;
    tVar2 = time((time_t *)0x0);
    sVar3 = strlen(hostname);
    if (sVar3 - 1 < 0x100) {
      memcpy(local_138,hostname,sVar3);
      uVar5 = sVar3 - 1;
      if (hostname[sVar3 - 1] != '.') {
        uVar5 = sVar3;
      }
      local_138[uVar5] = '\0';
      pCVar6 = (h->list).head;
      do {
        while( true ) {
          if (pCVar6 == (Curl_llist_element *)0x0) goto LAB_006dea94;
          e = (stsentry *)pCVar6->ptr;
          pCVar6 = pCVar6->next;
          if (tVar2 < e->expires) break;
          Curl_llist_remove(&h->list,(Curl_llist_element *)e,(void *)0x0);
          (*Curl_cfree)(e->host);
          (*Curl_cfree)(e);
        }
        if (((char)local_13c != '\0') && (e->includeSubDomains == true)) {
          __s = e->host;
          sVar3 = strlen(__s);
          lVar4 = uVar5 - sVar3;
          if ((sVar3 <= uVar5 && lVar4 != 0) &&
             ((local_138[lVar4 + -1] == '.' &&
              (iVar1 = curl_strnequal(local_138 + lVar4,__s,sVar3), iVar1 != 0)))) {
            return e;
          }
        }
        iVar1 = curl_strequal(local_138,e->host);
      } while (iVar1 == 0);
    }
  }
  return e;
}

Assistant:

struct stsentry *Curl_hsts(struct hsts *h, const char *hostname,
                           bool subdomain)
{
  if(h) {
    char buffer[MAX_HSTS_HOSTLEN + 1];
    time_t now = time(NULL);
    size_t hlen = strlen(hostname);
    struct Curl_llist_element *e;
    struct Curl_llist_element *n;

    if((hlen > MAX_HSTS_HOSTLEN) || !hlen)
      return NULL;
    memcpy(buffer, hostname, hlen);
    if(hostname[hlen-1] == '.')
      /* remove the trailing dot */
      --hlen;
    buffer[hlen] = 0;
    hostname = buffer;

    for(e = h->list.head; e; e = n) {
      struct stsentry *sts = e->ptr;
      n = e->next;
      if(sts->expires <= now) {
        /* remove expired entries */
        Curl_llist_remove(&h->list, &sts->node, NULL);
        hsts_free(sts);
        continue;
      }
      if(subdomain && sts->includeSubDomains) {
        size_t ntail = strlen(sts->host);
        if(ntail < hlen) {
          size_t offs = hlen - ntail;
          if((hostname[offs-1] == '.') &&
             strncasecompare(&hostname[offs], sts->host, ntail))
            return sts;
        }
      }
      if(strcasecompare(hostname, sts->host))
        return sts;
    }
  }
  return NULL; /* no match */
}